

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

bool __thiscall QCommandLineParser::isSet(QCommandLineParser *this,QCommandLineOption *option)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QCommandLineOption::names((QStringList *)&local_38,option);
  if ((undefined1 *)local_38.size == (undefined1 *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = isSet(this,local_38.ptr);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QCommandLineParser::isSet(const QCommandLineOption &option) const
{
    // option.names() might be empty if the constructor failed
    const auto names = option.names();
    return !names.isEmpty() && isSet(names.first());
}